

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall hta::Directory::Directory(Directory *this,json *config,bool use_mutex)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  pair<hta::Metric_&,_bool> pVar4;
  bool local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  type_conflict2 *local_200;
  type *inserted;
  Metric *metric;
  undefined1 local_1e8;
  pair<hta::Metric_&,_bool> local_1e0;
  pair<hta::Metric_&,_bool> *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  byte local_1a3;
  byte local_1a2;
  allocator<char> local_1a1;
  key_type local_1a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_180;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *metric_config;
  string name;
  iteration_proxy_internal *elem;
  iteration_proxy_internal __end2;
  iteration_proxy_internal __begin2;
  iteration_proxy<const_iterator> *__range2;
  key_type local_e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_c8;
  value_type *metrics;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [16];
  key_type local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type;
  bool use_mutex_local;
  json *config_local;
  Directory *this_local;
  
  std::unique_ptr<hta::storage::Directory,std::default_delete<hta::storage::Directory>>::
  unique_ptr<std::default_delete<hta::storage::Directory>,void>
            ((unique_ptr<hta::storage::Directory,std::default_delete<hta::storage::Directory>> *)
             this);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>_>
  ::unordered_map(&this->metrics_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  ::vector(&this->prefixes_);
  OptionalMutex::OptionalMutex(&this->mutex_,use_mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"type",(allocator<char> *)(local_80 + 0xf));
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(config,&local_70);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,pvVar2);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0xf));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"file");
  if (!bVar1) {
    std::__cxx11::string::string((string *)&metrics,(string *)local_50);
    throw_exception<hta::Exception,char_const*,std::__cxx11::string>
              ("Unknown directory type: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&metrics);
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)config,"path");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_a0,pvVar2);
  std::make_unique<hta::storage::file::Directory,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::unique_ptr<hta::storage::Directory,std::default_delete<hta::storage::Directory>>::operator=
            ((unique_ptr<hta::storage::Directory,std::default_delete<hta::storage::Directory>> *)
             this,(unique_ptr<hta::storage::file::Directory,_std::default_delete<hta::storage::file::Directory>_>
                   *)local_80);
  std::
  unique_ptr<hta::storage::file::Directory,_std::default_delete<hta::storage::file::Directory>_>::
  ~unique_ptr((unique_ptr<hta::storage::file::Directory,_std::default_delete<hta::storage::file::Directory>_>
               *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::count<char_const(&)[8]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)config,(char (*) [8])"metrics");
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"metrics",(allocator<char> *)((long)&__range2 + 7));
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(config,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    local_c8 = pvVar2;
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::is_object(pvVar2);
    if (!bVar1) {
      __assert_fail("metrics.is_object()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                    ,0x65,"hta::Directory::Directory(const json &, bool)");
    }
    __begin2.array_index =
         (size_t)nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::items(local_c8);
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::begin((iteration_proxy_internal *)&__end2.array_index,
            (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             *)&__begin2.array_index);
    nlohmann::detail::
    iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ::end((iteration_proxy_internal *)&elem,
          (iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           *)&__begin2.array_index);
    while (bVar1 = nlohmann::detail::
                   iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ::iteration_proxy_internal::operator!=
                             ((iteration_proxy_internal *)&__end2.array_index,
                              (iteration_proxy_internal *)&elem), bVar1) {
      name.field_2._8_8_ =
           nlohmann::detail::
           iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           ::iteration_proxy_internal::operator*((iteration_proxy_internal *)&__end2.array_index);
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::iteration_proxy_internal::key
                ((string *)&metric_config,(iteration_proxy_internal *)name.field_2._8_8_);
      local_180 = nlohmann::detail::
                  iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  ::iteration_proxy_internal::value((iteration_proxy_internal *)name.field_2._8_8_);
      local_1a2 = 0;
      local_1a3 = 0;
      sVar3 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::count<char_const(&)[7]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)local_180,(char (*) [7])"prefix");
      this_00 = local_180;
      local_2a1 = false;
      if (sVar3 != 0) {
        std::allocator<char>::allocator();
        local_1a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"prefix",&local_1a1)
        ;
        local_1a3 = 1;
        pvVar2 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(this_00,&local_1a0);
        local_2a1 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::get<bool,_bool,_0>(pvVar2);
      }
      if ((local_1a3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1a0);
      }
      if ((local_1a2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      }
      if (local_2a1 == false) {
        pVar4 = emplace(this,(string *)&metric_config,local_180);
        metric = pVar4.first;
        local_1e8 = pVar4.second;
        local_1d0 = &local_1e0;
        local_1e0.first = metric;
        local_1e0.second = (bool)local_1e8;
        inserted = (type *)std::get<0ul,hta::Metric&,bool>(local_1d0);
        local_200 = std::get<1ul,hta::Metric&,bool>(local_1d0);
        if ((*local_200 & 1U) == 0) {
          std::__cxx11::string::string((string *)&local_220,(string *)&metric_config);
          throw_exception<hta::Exception,char_const*,std::__cxx11::string>
                    ("duplicated metric name in initial configuration: ",&local_220);
        }
      }
      else {
        std::operator+(&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &metric_config,".");
        std::
        vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
        ::
        emplace_back<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
                  ((vector<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                    *)&this->prefixes_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                   local_180);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      std::__cxx11::string::~string((string *)&metric_config);
      nlohmann::detail::
      iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::iteration_proxy_internal::operator++((iteration_proxy_internal *)&__end2.array_index);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

Directory::Directory(const json& config, bool use_mutex) : mutex_(use_mutex)
{
    auto type = config.at("type").get<std::string>();
    if (type == "file")
    {
        directory_ = std::make_unique<storage::file::Directory>(config["path"].get<std::string>());
    }
    else
    {
        throw_exception("Unknown directory type: ", type);
    }

    if (config.count("metrics"))
    {
        auto& metrics = config.at("metrics");
        assert(metrics.is_object());
        for (const auto& elem : metrics.items())
        {
            std::string name = elem.key();
            const auto& metric_config = elem.value();
            if (metric_config.count("prefix") && metric_config.at("prefix").get<bool>())
            {
                // TODO check for overlapping prefixes
                // add . to end
                prefixes_.emplace_back(name + ".", metric_config);
            }
            else
            {
                const auto& [metric, inserted] = emplace(name, metric_config);
                (void)metric;
                if (!inserted)
                {
                    throw_exception("duplicated metric name in initial configuration: ", name);
                }
            }
        }
    }
}